

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O3

void pce_incspr(int *ip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int h;
  int w;
  int y;
  int x;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar1 = pcx_get_args(ip);
  if ((iVar1 != 0) &&
     (iVar1 = pcx_parse_args(0,pcx_nb_args,&local_34,&local_38,&local_3c,&local_40,0x10), iVar1 != 0
     )) {
    if (0 < local_40) {
      iVar3 = 0;
      iVar1 = local_40;
      iVar2 = local_3c;
      do {
        if (0 < iVar2) {
          iVar4 = 0;
          iVar5 = 0;
          do {
            iVar1 = pcx_pack_16x16_sprite(buffer,local_34 + iVar4,local_38 + iVar3 * 0x10);
            putbuffer(buffer,iVar1);
            iVar5 = iVar5 + 1;
            iVar4 = iVar4 + 0x10;
            iVar1 = local_40;
            iVar2 = local_3c;
          } while (iVar5 < local_3c);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar1);
    }
    if (pass == 1) {
      println();
    }
  }
  return;
}

Assistant:

void
pce_incspr(int *ip)
{
	int i, j;
	int x, y, w, h;
	int sx, sy;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 16))
		return;

	/* pack sprites */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* sprite coordinates */
			sx = x + (j << 4);
			sy = y + (i << 4);

			/* encode sprite */
			size = pcx_pack_16x16_sprite(buffer, sx, sy);

			/* store sprite */
			putbuffer(buffer, size);
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}